

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::
padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned_long_long,fmt::v6::basic_format_specs<wchar_t>>::hex_writer>
::operator()(padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned_long_long,fmt::v6::basic_format_specs<wchar_t>>::hex_writer>
             *this,wchar_t **it)

{
  wchar_t *pwVar1;
  
  pwVar1 = *it;
  if (*(long *)(this + 0x10) != 0) {
    pwVar1 = std::__copy_move<false,false,std::random_access_iterator_tag>::
             __copy_m<char_const*,wchar_t*>
                       (*(char **)(this + 8),*(char **)(this + 8) + *(long *)(this + 0x10),pwVar1);
    *it = pwVar1;
  }
  pwVar1 = std::__fill_n_a<wchar_t*,unsigned_long,wchar_t>
                     (pwVar1,*(undefined8 *)(this + 0x20),this + 0x18);
  *it = pwVar1;
  int_writer<unsigned_long_long,fmt::v6::basic_format_specs<wchar_t>>::hex_writer::operator()
            ((hex_writer *)(this + 0x28),it);
  return;
}

Assistant:

void operator()(It&& it) const {
      if (prefix.size() != 0)
        it = copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }